

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O3

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::nodeName
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema target,Schema scope,
          Reader brand,Maybe<capnp::InterfaceSchema::Method> *method)

{
  SchemaLoader *this_00;
  WirePointer WVar1;
  WirePointer WVar2;
  ulong uVar3;
  Reader brand_00;
  undefined1 auVar4 [40];
  Reader brand_01;
  Reader brand_02;
  Reader type;
  undefined8 uVar5;
  Branch *pBVar6;
  char *pcVar7;
  Schema *pSVar8;
  RemoveConst<capnp::Schema> *pRVar9;
  Schema *pSVar10;
  undefined8 uVar11;
  SegmentReader *pSVar12;
  ListElementCount LVar13;
  WirePointer WVar14;
  mapped_type *pmVar15;
  WirePointer WVar16;
  StringTree *pSVar17;
  WirePointer WVar18;
  ulong uVar19;
  StringTree *extraout_RAX;
  StringTree *pSVar20;
  WirePointer WVar21;
  ArrayPtr<const_char> *params;
  _Base_ptr p_Var22;
  ArrayPtr<const_char> *params_00;
  ElementCount EVar23;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  WirePointer id;
  size_t sVar26;
  WirePointer id_00;
  WirePointer id_01;
  _Base_ptr p_Var27;
  WirePointer *pWVar28;
  WirePointer *params_2;
  code *in_R9;
  _Rb_tree_color _Var29;
  bool bVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  Reader RVar35;
  StringPtr delim;
  StringPtr delim_00;
  Reader scopeBrand;
  Vector<capnp::Schema> targetPath;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:110:5)>
  _kjContext110;
  Array<kj::StringTree> bindings;
  Reader proto_1;
  Reader nested;
  Schema part;
  ArrayBuilder<kj::StringTree> parts;
  Schema parent_2;
  anon_class_8_1_a879b908 _kjContextFunc110;
  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  scopeBindings;
  Reader proto;
  undefined1 local_368 [24];
  undefined8 *puStack_350;
  Branch *local_348;
  WirePointer *pWStack_340;
  WirePointer *local_338;
  StringTree local_328;
  Vector<capnp::Schema> local_2e8;
  Vector<capnp::Schema> local_2c8;
  undefined1 local_2a8 [32];
  anon_union_40_1_a8c68091_for_NullableValue<kj::_::Debug::Context::Value>_2 local_288;
  StringTree **local_260;
  PointerReader local_258;
  ArrayPtr<const_char> local_238;
  long *local_228;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  uint local_218;
  undefined4 uStack_214;
  size_t sStack_210;
  Schema local_200;
  StructReader local_1f8;
  Maybe<capnp::InterfaceSchema::Method> *local_1c8;
  Schema local_1c0;
  CapnpcCapnpMain *local_1b8;
  Schema local_1b0;
  StringTree *local_1a8;
  StringTree *pSStack_1a0;
  StringTree *local_198;
  byte *local_190;
  StructReader local_188;
  StringTree *local_158;
  SchemaLoader *local_150;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::InterfaceSchema::Method>_2 *local_148;
  Schema local_140;
  StringTree *local_138;
  Schema local_130;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  local_128;
  Reader local_f8;
  ListReader local_c8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_2e8.builder.ptr = (Schema *)0x0;
  local_2e8.builder.pos = (RemoveConst<capnp::Schema> *)0x0;
  local_2e8.builder.endPtr = (Schema *)0x0;
  local_2c8.builder.endPtr = (Schema *)0x0;
  local_2c8.builder.ptr = (Schema *)0x0;
  local_2c8.builder.pos = (Schema *)0x0;
  local_1c8 = method;
  local_1c0.raw = scope.raw;
  local_1b8 = this;
  local_158 = __return_storage_ptr__;
  kj::Vector<capnp::Schema>::setCapacity(&local_2e8,4);
  (local_2e8.builder.pos)->raw = target.raw;
  local_2e8.builder.pos = local_2e8.builder.pos + 1;
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bVar30 = brand._reader.pointerCount == 0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_328.text.content.size_ = (size_t)brand._reader.pointers;
  if (bVar30) {
    local_328.text.content.size_ = (size_t)(WirePointer *)0x0;
  }
  local_328.text.content.disposer._0_4_ = 0x7fffffff;
  if (!bVar30) {
    local_328.text.content.disposer._0_4_ = brand._reader.nestingLimit;
  }
  uVar31 = 0;
  uVar32 = 0;
  uVar33 = 0;
  uVar34 = 0;
  if (!bVar30) {
    uVar31 = brand._reader.segment._0_4_;
    uVar32 = brand._reader.segment._4_4_;
    uVar33 = brand._reader.capTable._0_4_;
    uVar34 = brand._reader.capTable._4_4_;
  }
  local_328.size_ = CONCAT44(uVar32,uVar31);
  local_328.text.content.ptr = (char *)CONCAT44(uVar34,uVar33);
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  _::PointerReader::getList
            ((ListReader *)local_2a8,(PointerReader *)&local_328,INLINE_COMPOSITE,(word *)0x0);
  uVar31 = local_2a8._24_4_;
  local_200.raw = target.raw;
  if (local_2a8._24_4_ != 0) {
    EVar23 = 0;
    do {
      _::ListReader::getStructElement((StructReader *)&local_328,(ListReader *)local_2a8,EVar23);
      if (((uint)local_328.branches.ptr < 0x50) ||
         ((short)(((WirePointer *)(local_328.text.content.size_ + 8))->offsetAndKind).value == 0)) {
        bVar30 = local_328.branches.ptr._4_2_ == 0;
        local_228 = (long *)CONCAT44(local_328.text.content.disposer._4_4_,
                                     (int)local_328.text.content.disposer);
        if (bVar30) {
          local_228 = (long *)0x0;
        }
        uStack_220 = (int)local_328.branches.size_;
        if (bVar30) {
          uStack_220 = 0x7fffffff;
        }
        local_238.ptr._0_4_ = 0;
        local_238.ptr._4_4_ = 0;
        local_238.size_._0_4_ = 0;
        local_238.size_._4_4_ = 0;
        if (!bVar30) {
          local_238.ptr._0_4_ = (undefined4)local_328.size_;
          local_238.ptr._4_4_ = local_328.size_._4_4_;
          local_238.size_._0_4_ = local_328.text.content.ptr._0_4_;
          local_238.size_._4_4_ = local_328.text.content.ptr._4_4_;
        }
        _::PointerReader::getList
                  ((ListReader *)local_368,(PointerReader *)&local_238,INLINE_COMPOSITE,(word *)0x0)
        ;
        if ((uint)local_328.branches.ptr < 0x40) {
          WVar14.offsetAndKind.value = 0;
          WVar14.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          WVar14 = *(WirePointer *)local_328.text.content.size_;
        }
        local_238.ptr = (char *)WVar14;
        pmVar15 = std::
                  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                  ::operator[]((map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                                *)&local_128,(key_type *)&local_238);
        *(Branch **)&(pmVar15->reader).structDataSize = local_348;
        *(WirePointer **)&(pmVar15->reader).nestingLimit = pWStack_340;
        (pmVar15->reader).ptr = (byte *)local_368._16_8_;
        *(undefined8 **)&(pmVar15->reader).elementCount = puStack_350;
        (pmVar15->reader).segment = (SegmentReader *)local_368._0_8_;
        (pmVar15->reader).capTable = (CapTableReader *)local_368._8_8_;
      }
      EVar23 = EVar23 + 1;
    } while (uVar31 != EVar23);
  }
  local_328.size_ = (size_t)local_200.raw;
  this_00 = &local_1b8->schemaLoader;
  while( true ) {
    Schema::getProto((Reader *)local_2a8,(Schema *)&local_328);
    if (((uint)local_288._0_4_ < 0xc0) ||
       (*(WirePointer *)(local_2a8._16_8_ + 0x10) == (WirePointer)0x0)) break;
    Schema::getProto((Reader *)local_2a8,(Schema *)&local_328);
    if ((uint)local_288._0_4_ < 0xc0) {
      id.offsetAndKind.value = 0;
      id.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      id = *(WirePointer *)(local_2a8._16_8_ + 0x10);
    }
    local_48 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    uStack_40 = 0x7fffffff;
    auVar4 = ZEXT1640(ZEXT816(0));
    brand_00._reader._40_8_ = 0x7fffffff;
    brand_00._reader.segment = (SegmentReader *)auVar4._0_8_;
    brand_00._reader.capTable = (CapTableReader *)auVar4._8_8_;
    brand_00._reader.data = (void *)auVar4._16_8_;
    brand_00._reader.pointers = (WirePointer *)auVar4._24_8_;
    brand_00._reader.dataSize = auVar4._32_4_;
    brand_00._reader.pointerCount = auVar4._36_2_;
    brand_00._reader._38_2_ = auVar4._38_2_;
    local_328.size_ = (size_t)SchemaLoader::get(this_00,(uint64_t)id,brand_00,(Schema)0x1c5ce0);
    if (local_2e8.builder.pos == local_2e8.builder.endPtr) {
      sVar26 = (long)local_2e8.builder.pos - (long)local_2e8.builder.ptr >> 2;
      if (local_2e8.builder.pos == local_2e8.builder.ptr) {
        sVar26 = 4;
      }
      kj::Vector<capnp::Schema>::setCapacity(&local_2e8,sVar26);
    }
    (local_2e8.builder.pos)->raw = (RawBrandedSchema *)local_328.size_;
    local_2e8.builder.pos = local_2e8.builder.pos + 1;
  }
  local_328.size_ = (size_t)local_1c0.raw;
  if (local_2c8.builder.pos == local_2c8.builder.endPtr) {
    sVar26 = 4;
    if (local_2c8.builder.pos != local_2c8.builder.ptr) {
      sVar26 = (long)local_2c8.builder.pos - (long)local_2c8.builder.ptr >> 2;
    }
    kj::Vector<capnp::Schema>::setCapacity(&local_2c8,sVar26);
  }
  (local_2c8.builder.pos)->raw = (RawBrandedSchema *)local_328.size_;
  while( true ) {
    local_2c8.builder.pos = local_2c8.builder.pos + 1;
    Schema::getProto((Reader *)local_2a8,(Schema *)&local_328);
    if (((uint)local_288._0_4_ < 0xc0) ||
       (*(WirePointer *)(local_2a8._16_8_ + 0x10) == (WirePointer)0x0)) break;
    Schema::getProto((Reader *)local_2a8,(Schema *)&local_328);
    if ((uint)local_288._0_4_ < 0xc0) {
      id_00.offsetAndKind.value = 0;
      id_00.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      id_00 = *(WirePointer *)(local_2a8._16_8_ + 0x10);
    }
    local_78 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    uStack_70 = 0x7fffffff;
    auVar4 = ZEXT1640(ZEXT816(0));
    brand_01._reader._40_8_ = 0x7fffffff;
    brand_01._reader.segment = (SegmentReader *)auVar4._0_8_;
    brand_01._reader.capTable = (CapTableReader *)auVar4._8_8_;
    brand_01._reader.data = (void *)auVar4._16_8_;
    brand_01._reader.pointers = (WirePointer *)auVar4._24_8_;
    brand_01._reader.dataSize = auVar4._32_4_;
    brand_01._reader.pointerCount = auVar4._36_2_;
    brand_01._reader._38_2_ = auVar4._38_2_;
    local_328.size_ = (size_t)SchemaLoader::get(this_00,(uint64_t)id_00,brand_01,(Schema)0x1c5ce0);
    if (local_2c8.builder.pos == local_2c8.builder.endPtr) {
      sVar26 = (long)local_2c8.builder.pos - (long)local_2c8.builder.ptr >> 2;
      if (local_2c8.builder.pos == local_2c8.builder.ptr) {
        sVar26 = 4;
      }
      kj::Vector<capnp::Schema>::setCapacity(&local_2c8,sVar26);
    }
    (local_2c8.builder.pos)->raw = (RawBrandedSchema *)local_328.size_;
  }
  if (local_2c8.builder.pos != local_2c8.builder.ptr) {
    do {
      if (((ulong)((long)local_2e8.builder.pos - (long)local_2e8.builder.ptr) < 9) ||
         (local_2c8.builder.pos[-1].raw != local_2e8.builder.pos[-1].raw)) break;
      Schema::getProto((Reader *)local_2a8,local_2c8.builder.pos + -1);
      if ((uint)local_288._0_4_ < 0x40) {
        WVar16.offsetAndKind.value = 0;
        WVar16.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        WVar16 = *(WirePointer *)local_2a8._16_8_;
      }
      if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var25 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var27 = &local_128._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var24 = p_Var27;
          p_Var22 = p_Var25;
          WVar1.offsetAndKind.value = p_Var22[1]._M_color;
          WVar1.field_1 = *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)&p_Var22[1].field_0x4;
          p_Var27 = p_Var22;
          if ((ulong)WVar1 < (ulong)WVar16) {
            p_Var27 = p_Var24;
          }
          p_Var25 = (&p_Var22->_M_left)[(ulong)WVar1 < (ulong)WVar16];
        } while ((&p_Var22->_M_left)[(ulong)WVar1 < (ulong)WVar16] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var27 != &local_128._M_impl.super__Rb_tree_header) {
          if ((ulong)WVar1 < (ulong)WVar16) {
            p_Var22 = p_Var24;
          }
          WVar2.offsetAndKind.value = p_Var22[1]._M_color;
          WVar2.field_1 = *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)&p_Var22[1].field_0x4;
          if ((ulong)WVar2 <= (ulong)WVar16) break;
        }
      }
      local_2c8.builder.pos = local_2c8.builder.pos + -1;
      local_2e8.builder.pos = local_2e8.builder.pos + -1;
    } while (local_2c8.builder.pos != local_2c8.builder.ptr);
  }
  local_200.raw = (RawBrandedSchema *)(_::NULL_SCHEMA + 0x48);
  sVar26 = (long)local_2e8.builder.pos - (long)local_2e8.builder.ptr >> 3;
  params_2 = (WirePointer *)0x0;
  pSVar17 = (StringTree *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x38,0,sVar26,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_198 = pSVar17 + sVar26;
  local_190 = (byte *)&kj::_::HeapArrayDisposer::instance;
  pSVar20 = pSVar17;
  if (local_2e8.builder.pos != local_2e8.builder.ptr) {
    local_148 = &(local_1c8->ptr).field_1;
    local_1a8 = pSVar17;
    local_150 = this_00;
    do {
      local_1b0.raw = local_2e8.builder.pos[-1].raw;
      pSStack_1a0 = pSVar17;
      Schema::getProto(&local_f8,&local_1b0);
      local_348 = (Branch *)0x0;
      pWStack_340 = (WirePointer *)0x0;
      local_368._16_8_ = (WirePointer *)0x0;
      puStack_350 = (undefined8 *)0x0;
      local_368._0_8_ = (SegmentReader *)0x0;
      local_368._8_8_ = (CapTableReader *)0x0;
      local_338 = (WirePointer *)0x0;
      if ((local_f8._reader.dataSize < 0xc0) ||
         (*(ulong *)((long)local_f8._reader.data + 0x10) == 0)) {
        uVar31 = local_f8._reader.segment._0_4_;
        uVar32 = local_f8._reader.segment._4_4_;
        uVar33 = local_f8._reader.capTable._0_4_;
        uVar34 = local_f8._reader.capTable._4_4_;
        local_328.text.content.disposer._0_4_ = local_f8._reader.nestingLimit;
        local_328.text.content.size_ = (size_t)local_f8._reader.pointers;
        if (local_f8._reader.pointerCount == 0) {
          local_328.text.content.size_ = 0;
          uVar31 = 0;
          uVar32 = 0;
          uVar33 = 0;
          uVar34 = 0;
          local_328.text.content.disposer._0_4_ = 0x7fffffff;
        }
        local_328.size_ = CONCAT44(uVar32,uVar31);
        local_328.text.content.ptr = (char *)CONCAT44(uVar34,uVar33);
        local_238 = (ArrayPtr<const_char>)
                    _::PointerReader::getBlob<capnp::Text>
                              ((PointerReader *)&local_328,(void *)0x0,0);
        local_328.size_ = CONCAT71(local_328.size_._1_7_,0x22);
        kj::strTree<char_const(&)[10],capnp::Text::Reader,char>
                  ((StringTree *)local_2a8,(kj *)"import \"/",(char (*) [10])&local_238,
                   (Reader *)&local_328,(char *)params_2);
        pWVar28 = (WirePointer *)local_368._16_8_;
        uVar5 = local_368._8_8_;
        local_368._0_8_ = local_2a8._0_8_;
        if ((CapTableReader *)local_368._8_8_ != (CapTableReader *)0x0) {
          local_368._8_8_ = (CapTableReader *)0x0;
          local_368._16_8_ = (byte *)0x0;
          in_R9 = (code *)0x0;
          (**(code **)*puStack_350)(puStack_350,uVar5,1);
          params_2 = pWVar28;
        }
        pWVar28 = pWStack_340;
        pBVar6 = local_348;
        local_368._8_8_ = local_2a8._8_8_;
        local_368._16_8_ = local_2a8._16_8_;
        puStack_350 = (undefined8 *)local_2a8._24_8_;
        local_2a8._8_8_ = (Schema)0x0;
        local_2a8._16_8_ = (WirePointer *)0x0;
        if (local_348 != (Branch *)0x0) {
          local_348 = (Branch *)0x0;
          pWStack_340 = (WirePointer *)0x0;
          in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
          (*(code *)**(undefined8 **)local_338)(local_338,pBVar6,0x40);
          params_2 = pWVar28;
        }
        pWVar28 = (WirePointer *)local_2a8._16_8_;
        uVar5 = local_2a8._8_8_;
        local_348 = (Branch *)local_288.value.file;
        pWStack_340 = (WirePointer *)local_288._8_8_;
        local_338 = (WirePointer *)local_288.value.description.content.ptr;
        local_288.value.file = (char *)0x0;
        local_288._8_8_ = (WirePointer *)0x0;
        if ((Schema)local_2a8._8_8_ != (Schema)0x0) {
          local_2a8._8_8_ = (Schema)0x0;
          local_2a8._16_8_ = (WirePointer *)0x0;
          in_R9 = (code *)0x0;
          (*(code *)(*(Arena **)local_2a8._24_8_)->_vptr_Arena)(local_2a8._24_8_,uVar5,1);
          params_2 = pWVar28;
        }
      }
      else {
        local_130.raw = local_1b0.raw;
        Schema::getProto((Reader *)&local_238,&local_130);
        local_138 = (StringTree *)&local_238;
        kj::_::Debug::Context::Context((Context *)local_2a8);
        local_2a8._0_8_ = &PTR__Context_001c43a0;
        local_260 = &local_138;
        if (local_218 < 0xc0) {
          id_01.offsetAndKind.value = 0;
          id_01.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          id_01 = *(WirePointer *)(local_228 + 2);
        }
        local_188.dataSize = 0;
        local_188.pointerCount = 0;
        local_188._38_2_ = 0;
        local_188.data = (short *)0x0;
        local_188.pointers = (WirePointer *)0x0;
        local_188.segment = (SegmentReader *)0x0;
        local_188.capTable = (CapTableReader *)0x0;
        local_188.nestingLimit = 0x7fffffff;
        local_188._44_4_ = 0;
        auVar4 = ZEXT1640(ZEXT816(0));
        brand_02._reader._40_8_ = 0x7fffffff;
        brand_02._reader.segment = (SegmentReader *)auVar4._0_8_;
        brand_02._reader.capTable = (CapTableReader *)auVar4._8_8_;
        brand_02._reader.data = (void *)auVar4._16_8_;
        brand_02._reader.pointers = (WirePointer *)auVar4._24_8_;
        brand_02._reader.dataSize = auVar4._32_4_;
        brand_02._reader.pointerCount = auVar4._36_2_;
        brand_02._reader._38_2_ = auVar4._38_2_;
        local_140 = SchemaLoader::get(local_150,(uint64_t)id_01,brand_02,local_200);
        Schema::getProto((Reader *)&local_1f8,&local_140);
        local_258.pointer = local_1f8.pointers + 1;
        if (local_1f8.pointerCount < 2) {
          local_258.pointer = (WirePointer *)0x0;
          uVar31 = 0;
          uVar32 = 0;
          uVar33 = 0;
          uVar34 = 0;
          local_258.nestingLimit = 0x7fffffff;
        }
        else {
          uVar31 = local_1f8.segment._0_4_;
          uVar32 = local_1f8.segment._4_4_;
          uVar33 = local_1f8.capTable._0_4_;
          uVar34 = local_1f8.capTable._4_4_;
          local_258.nestingLimit = local_1f8.nestingLimit;
        }
        local_258.segment = (SegmentReader *)CONCAT44(uVar32,uVar31);
        local_258.capTable = (CapTableReader *)CONCAT44(uVar34,uVar33);
        _::PointerReader::getList(&local_c8,&local_258,INLINE_COMPOSITE,(word *)0x0);
        LVar13 = local_c8.elementCount;
        if (local_c8.elementCount == 0) {
LAB_0013d7a6:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                    ((Fault *)&local_c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++"
                     ,0x75,FAILED,(char *)0x0,
                     "\"A schema Node\'s supposed scope did not contain the node as a NestedNode.\""
                     ,(char (*) [73])
                      "A schema Node\'s supposed scope did not contain the node as a NestedNode.");
          kj::_::Debug::Fault::fatal((Fault *)&local_c8);
        }
        EVar23 = 0;
        while( true ) {
          _::ListReader::getStructElement(&local_1f8,&local_c8,EVar23);
          if (local_1f8.dataSize < 0x40) {
            WVar18.offsetAndKind.value = 0;
            WVar18.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          }
          else {
            WVar18 = *local_1f8.data;
          }
          if (local_218 < 0x40) {
            WVar21.offsetAndKind.value = 0;
            WVar21.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          }
          else {
            WVar21 = (WirePointer)*local_228;
          }
          if (WVar18 == WVar21) break;
          EVar23 = EVar23 + 1;
          if (LVar13 == EVar23) goto LAB_0013d7a6;
        }
        local_258.nestingLimit = local_1f8.nestingLimit;
        local_258.pointer = local_1f8.pointers;
        if (local_1f8.pointerCount == 0) {
          local_258.pointer = (WirePointer *)0x0;
          local_258.nestingLimit = 0x7fffffff;
        }
        uVar31 = 0;
        uVar32 = 0;
        uVar33 = 0;
        uVar34 = 0;
        if (local_1f8.pointerCount != 0) {
          uVar31 = local_1f8.segment._0_4_;
          uVar32 = local_1f8.segment._4_4_;
          uVar33 = local_1f8.capTable._0_4_;
          uVar34 = local_1f8.capTable._4_4_;
        }
        local_258.segment = (SegmentReader *)CONCAT44(uVar32,uVar31);
        local_258.capTable = (CapTableReader *)CONCAT44(uVar34,uVar33);
        RVar35 = _::PointerReader::getBlob<capnp::Text>(&local_258,(void *)0x0,0);
        kj::_::Debug::Context::~Context((Context *)local_2a8);
        local_2a8._8_8_ = RVar35.super_StringPtr.content.size_ - 1;
        local_2a8._0_8_ = RVar35.super_StringPtr.content.ptr;
        kj::StringTree::concat<kj::ArrayPtr<char_const>>(&local_328,(StringTree *)local_2a8,params);
        pWVar28 = (WirePointer *)local_368._16_8_;
        uVar5 = local_368._8_8_;
        local_368._0_8_ = local_328.size_;
        if ((CapTableReader *)local_368._8_8_ != (CapTableReader *)0x0) {
          local_368._8_8_ = (CapTableReader *)0x0;
          local_368._16_8_ = (byte *)0x0;
          in_R9 = (code *)0x0;
          (**(code **)*puStack_350)(puStack_350,uVar5,1);
          params_2 = pWVar28;
        }
        pWVar28 = pWStack_340;
        pBVar6 = local_348;
        local_368._8_8_ = local_328.text.content.ptr;
        puStack_350 = (undefined8 *)
                      CONCAT44(local_328.text.content.disposer._4_4_,
                               (int)local_328.text.content.disposer);
        local_368._16_8_ = local_328.text.content.size_;
        local_328.text.content.ptr = (char *)0x0;
        local_328.text.content.size_ = 0;
        if (local_348 != (Branch *)0x0) {
          local_348 = (Branch *)0x0;
          pWStack_340 = (WirePointer *)0x0;
          in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
          (*(code *)**(undefined8 **)local_338)(local_338,pBVar6,0x40);
          params_2 = pWVar28;
        }
        pWVar28 = (WirePointer *)local_328.text.content.size_;
        pcVar7 = local_328.text.content.ptr;
        local_348 = local_328.branches.ptr;
        pWStack_340 = (WirePointer *)local_328.branches.size_;
        local_338 = (WirePointer *)local_328.branches.disposer;
        local_328.branches.ptr = (Branch *)0x0;
        local_328.branches.size_ = 0;
        if ((RawBrandedSchema *)local_328.text.content.ptr != (RawBrandedSchema *)0x0) {
          local_328.text.content.ptr = (char *)0x0;
          local_328.text.content.size_ = 0;
          in_R9 = (code *)0x0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_328.text.content.disposer._4_4_,
                               (int)local_328.text.content.disposer))
                    ((undefined8 *)
                     CONCAT44(local_328.text.content.disposer._4_4_,
                              (int)local_328.text.content.disposer),pcVar7,1);
          params_2 = pWVar28;
        }
      }
      if (local_f8._reader.dataSize < 0x40) {
        uVar19 = 0;
      }
      else {
        uVar19 = *local_f8._reader.data;
      }
      if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var25 = &local_128._M_impl.super__Rb_tree_header._M_header;
        p_Var27 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          p_Var22 = p_Var27;
          p_Var24 = p_Var25;
          uVar3 = *(ulong *)(p_Var22 + 1);
          p_Var25 = p_Var22;
          if (uVar3 < uVar19) {
            p_Var25 = p_Var24;
          }
          p_Var27 = (&p_Var22->_M_left)[uVar3 < uVar19];
        } while ((&p_Var22->_M_left)[uVar3 < uVar19] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var25 != &local_128._M_impl.super__Rb_tree_header) {
          if (uVar3 < uVar19) {
            p_Var22 = p_Var24;
          }
          if (*(ulong *)(p_Var22 + 1) <= uVar19) {
            _Var29 = p_Var25[2]._M_color;
            local_1f8.capTable =
                 (CapTableReader *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,(ulong)_Var29,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
            local_1f8.data = (void *)((long)local_1f8.capTable + (ulong)_Var29 * 0x38);
            local_1f8.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
            local_1f8.segment = (SegmentReader *)local_1f8.capTable;
            if (p_Var25[2]._M_color != _S_red) {
              _Var29 = _S_red;
              do {
                _::ListReader::getStructElement
                          (&local_188,(ListReader *)&p_Var25[1]._M_parent,_Var29);
                if (local_188.dataSize < 0x10) {
LAB_0013d1ed:
                  local_238.size_ = 10;
                  local_238.ptr = "AnyPointer";
                  kj::StringTree::concat<kj::ArrayPtr<char_const>>
                            (&local_328,(StringTree *)&local_238,params_00);
                }
                else if (*local_188.data == 1) {
                  bVar30 = local_188.pointerCount == 0;
                  local_c8.ptr = (byte *)local_188.pointers;
                  if (bVar30) {
                    local_c8.ptr = (byte *)0x0;
                  }
                  local_c8.elementCount = local_188.nestingLimit;
                  if (bVar30) {
                    local_c8.elementCount = 0x7fffffff;
                  }
                  local_c8.segment._0_4_ = 0;
                  local_c8.segment._4_4_ = 0;
                  local_c8.capTable._0_4_ = 0;
                  local_c8.capTable._4_4_ = 0;
                  if (!bVar30) {
                    local_c8.segment._0_4_ = local_188.segment._0_4_;
                    local_c8.segment._4_4_ = local_188.segment._4_4_;
                    local_c8.capTable._0_4_ = local_188.capTable._0_4_;
                    local_c8.capTable._4_4_ = local_188.capTable._4_4_;
                  }
                  _::PointerReader::getStruct
                            ((StructReader *)&local_238,(PointerReader *)&local_c8,(word *)0x0);
                  bVar30 = (local_1c8->ptr).isSet;
                  local_2a8[0] = bVar30;
                  if (bVar30 == true) {
                    local_2a8._8_8_ = (local_148->value).parent.super_Schema.raw;
                    local_2a8._16_8_ = *(undefined8 *)((long)local_148 + 8);
                    local_2a8._24_8_ = (local_148->value).proto._reader.segment;
                    local_288.value.file = (char *)(local_148->value).proto._reader.capTable;
                    local_288._8_8_ = (local_148->value).proto._reader.data;
                    local_288.value.description.content.ptr =
                         (char *)(local_148->value).proto._reader.pointers;
                    local_288._24_4_ = (((Reader *)((long)local_148 + 0x10))->_reader).dataSize;
                    local_288._28_2_ = (((Reader *)((long)local_148 + 0x10))->_reader).pointerCount;
                    local_288._30_2_ =
                         *(undefined2 *)&(((Reader *)((long)local_148 + 0x10))->_reader).field_0x26;
                    local_288.value.description.content.disposer =
                         (ArrayDisposer *)
                         *(undefined8 *)&(local_148->value).proto._reader.nestingLimit;
                  }
                  type._reader.pointers._4_4_ = uStack_21c;
                  type._reader.pointers._0_4_ = uStack_220;
                  type._reader.pointerCount = (StructPointerCount)uStack_214;
                  type._reader._38_2_ = uStack_214._2_2_;
                  type._reader.dataSize = local_218;
                  type._reader.data = local_228;
                  type._reader.segment = (SegmentReader *)local_238.ptr;
                  type._reader.capTable = (CapTableReader *)local_238.size_;
                  type._reader._40_8_ = sStack_210;
                  genType(&local_328,local_1b8,type,local_1c0,
                          (Maybe<capnp::InterfaceSchema::Method> *)local_2a8);
                }
                else {
                  if (*local_188.data == 0) goto LAB_0013d1ed;
                  local_238.size_ = 0x11;
                  local_238.ptr = "<unknown binding>";
                  kj::StringTree::concat<kj::ArrayPtr<char_const>>
                            (&local_328,(StringTree *)&local_238,params_00);
                }
                (local_1f8.capTable)->_vptr_CapTableReader = (_func_int **)local_328.size_;
                *(char **)&((SegmentId *)((long)local_1f8.capTable + 8))->value =
                     local_328.text.content.ptr;
                ((ArrayPtr<const_capnp::word> *)((long)local_1f8.capTable + 0x10))->ptr =
                     (word *)local_328.text.content.size_;
                local_328.text.content.ptr = (char *)0x0;
                local_328.text.content.size_ = 0;
                ((ArrayPtr<const_capnp::word> *)((long)local_1f8.capTable + 0x10))->size_ =
                     CONCAT44(local_328.text.content.disposer._4_4_,
                              (int)local_328.text.content.disposer);
                *(Branch **)((long)local_1f8.capTable + 0x20) = local_328.branches.ptr;
                ((SegmentReader *)((long)local_1f8.capTable + 0x28))->arena =
                     (Arena *)local_328.branches.size_;
                *(ArrayDisposer **)&((SegmentReader *)((long)local_1f8.capTable + 0x28))->id =
                     local_328.branches.disposer;
                local_1f8.capTable =
                     (CapTableReader *)&((SegmentReader *)((long)local_1f8.capTable + 0x28))->ptr;
                _Var29 = _Var29 + _S_black;
              } while (_Var29 != p_Var25[2]._M_color);
            }
            local_258.capTable =
                 (CapTableReader *)
                 (((long)local_1f8.capTable - (long)local_1f8.segment >> 3) * 0x6db6db6db6db6db7);
            delim.content.size_ = 3;
            delim.content.ptr = ", ";
            local_258.segment = local_1f8.segment;
            local_258.pointer = local_1f8.pointers;
            kj::StringTree::StringTree(&local_328,(Array<kj::StringTree> *)&local_258,delim);
            params_2 = (WirePointer *)0x19f9a3;
            kj::strTree<kj::StringTree,char_const(&)[2],kj::StringTree,char_const(&)[2]>
                      ((StringTree *)local_2a8,(kj *)local_368,(StringTree *)0x1938a9,
                       (char (*) [2])&local_328,(StringTree *)0x19f9a3,(char (*) [2])in_R9);
            pWVar28 = (WirePointer *)local_368._16_8_;
            uVar5 = local_368._8_8_;
            local_368._0_8_ = local_2a8._0_8_;
            if ((RawBrandedSchema *)local_368._8_8_ != (RawBrandedSchema *)0x0) {
              local_368._8_8_ = (CapTableReader *)0x0;
              local_368._16_8_ = (byte *)0x0;
              in_R9 = (code *)0x0;
              (*(code *)(*(Arena **)puStack_350)->_vptr_Arena)(puStack_350,uVar5,1);
              params_2 = pWVar28;
            }
            pWVar28 = pWStack_340;
            pBVar6 = local_348;
            local_368._8_8_ = local_2a8._8_8_;
            local_368._16_8_ = local_2a8._16_8_;
            puStack_350 = (undefined8 *)local_2a8._24_8_;
            local_2a8._8_8_ = (Schema)0x0;
            local_2a8._16_8_ = (WirePointer *)0x0;
            if (local_348 != (Branch *)0x0) {
              local_348 = (Branch *)0x0;
              pWStack_340 = (WirePointer *)0x0;
              in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
              (**(code **)*local_338)(local_338,pBVar6,0x40);
              params_2 = pWVar28;
            }
            pWVar28 = (WirePointer *)local_2a8._16_8_;
            uVar5 = local_2a8._8_8_;
            local_348 = (Branch *)local_288.value.file;
            pWStack_340 = (WirePointer *)local_288._8_8_;
            local_338 = (WirePointer *)local_288.value.description.content.ptr;
            local_288.value.file = (char *)0x0;
            local_288._8_8_ = (WirePointer *)0x0;
            if ((Schema)local_2a8._8_8_ != (Schema)0x0) {
              local_2a8._8_8_ = (Schema)0x0;
              local_2a8._16_8_ = (WirePointer *)0x0;
              in_R9 = (code *)0x0;
              (*(code *)(*(Arena **)local_2a8._24_8_)->_vptr_Arena)(local_2a8._24_8_,uVar5,1);
              params_2 = pWVar28;
            }
            pWVar28 = (WirePointer *)local_328.branches.size_;
            pBVar6 = local_328.branches.ptr;
            if (local_328.branches.ptr != (Branch *)0x0) {
              local_328.branches.ptr = (Branch *)0x0;
              local_328.branches.size_ = 0;
              in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
              (**(code **)*(WirePointer *)local_328.branches.disposer)
                        (local_328.branches.disposer,pBVar6,0x40);
              params_2 = pWVar28;
            }
            pWVar28 = (WirePointer *)local_328.text.content.size_;
            pcVar7 = local_328.text.content.ptr;
            if ((RawBrandedSchema *)local_328.text.content.ptr != (RawBrandedSchema *)0x0) {
              local_328.text.content.ptr = (char *)0x0;
              local_328.text.content.size_ = 0;
              in_R9 = (code *)0x0;
              (*(code *)**(undefined8 **)
                          CONCAT44(local_328.text.content.disposer._4_4_,
                                   (int)local_328.text.content.disposer))
                        ((undefined8 *)
                         CONCAT44(local_328.text.content.disposer._4_4_,
                                  (int)local_328.text.content.disposer),pcVar7,1);
              params_2 = pWVar28;
            }
            pWVar28 = (WirePointer *)local_258.capTable;
            pSVar12 = local_258.segment;
            pSVar17 = pSStack_1a0;
            if (local_258.segment != (SegmentReader *)0x0) {
              local_258.segment = (SegmentReader *)0x0;
              local_258.capTable = (CapTableReader *)0x0;
              in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct;
              (**(code **)*local_258.pointer)(local_258.pointer,pSVar12,0x38);
              pSVar17 = pSStack_1a0;
              params_2 = pWVar28;
            }
          }
        }
      }
      pSVar17->size_ = local_368._0_8_;
      (pSVar17->text).content.ptr = (char *)local_368._8_8_;
      (pSVar17->text).content.size_ = local_368._16_8_;
      local_368._8_8_ = (CapTableReader *)0x0;
      local_368._16_8_ = (byte *)0x0;
      (pSVar17->text).content.disposer = (ArrayDisposer *)puStack_350;
      (pSVar17->branches).ptr = local_348;
      (pSVar17->branches).size_ = (size_t)pWStack_340;
      (pSVar17->branches).disposer = (ArrayDisposer *)local_338;
      pSVar17 = pSVar17 + 1;
      local_2e8.builder.pos = local_2e8.builder.pos + -1;
      pSVar20 = local_1a8;
    } while (local_2e8.builder.pos != local_2e8.builder.ptr);
  }
  local_2a8._8_8_ = ((long)pSVar17 - (long)pSVar20 >> 3) * 0x6db6db6db6db6db7;
  local_1a8 = (StringTree *)0x0;
  pSStack_1a0 = (StringTree *)0x0;
  local_198 = (StringTree *)0x0;
  delim_00.content.size_ = 2;
  delim_00.content.ptr = ".";
  local_2a8._0_8_ = pSVar20;
  local_2a8._16_8_ = local_190;
  kj::StringTree::StringTree(local_158,(Array<kj::StringTree> *)local_2a8,delim_00);
  uVar11 = local_2a8._8_8_;
  uVar5 = local_2a8._0_8_;
  if ((StringTree *)local_2a8._0_8_ != (StringTree *)0x0) {
    local_2a8._0_8_ = (StringTree *)0x0;
    local_2a8._8_8_ = (Schema)0x0;
    (*(code *)**(undefined8 **)local_2a8._16_8_)
              (local_2a8._16_8_,uVar5,0x38,uVar11,uVar11,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  ::~_Rb_tree(&local_128);
  pSVar10 = local_2c8.builder.endPtr;
  pRVar9 = local_2c8.builder.pos;
  pSVar8 = local_2c8.builder.ptr;
  pSVar20 = extraout_RAX;
  if (local_2c8.builder.ptr != (Schema *)0x0) {
    local_2c8.builder.ptr = (Schema *)0x0;
    local_2c8.builder.pos = (Schema *)0x0;
    local_2c8.builder.endPtr = (Schema *)0x0;
    pSVar20 = (StringTree *)
              (*(code *)**(undefined8 **)local_2c8.builder.disposer)
                        (local_2c8.builder.disposer,pSVar8,8,(long)pRVar9 - (long)pSVar8 >> 3,
                         (long)pSVar10 - (long)pSVar8 >> 3,0);
  }
  pSVar10 = local_2e8.builder.endPtr;
  pRVar9 = local_2e8.builder.pos;
  pSVar8 = local_2e8.builder.ptr;
  if (local_2e8.builder.ptr != (Schema *)0x0) {
    local_2e8.builder.ptr = (Schema *)0x0;
    local_2e8.builder.pos = (RemoveConst<capnp::Schema> *)0x0;
    local_2e8.builder.endPtr = (Schema *)0x0;
    pSVar20 = (StringTree *)
              (*(code *)**(undefined8 **)local_2e8.builder.disposer)
                        (local_2e8.builder.disposer,pSVar8,8,(long)pRVar9 - (long)pSVar8 >> 3,
                         (long)pSVar10 - (long)pSVar8 >> 3,0);
  }
  return pSVar20;
}

Assistant:

kj::StringTree nodeName(Schema target, Schema scope, schema::Brand::Reader brand,
                          kj::Maybe<InterfaceSchema::Method> method) {
    kj::Vector<Schema> targetPath;
    kj::Vector<Schema> scopeParts;

    targetPath.add(target);

    std::map<uint64_t, List<schema::Brand::Binding>::Reader> scopeBindings;
    for (auto scopeBrand: brand.getScopes()) {
      switch (scopeBrand.which()) {
        case schema::Brand::Scope::BIND:
          scopeBindings[scopeBrand.getScopeId()] = scopeBrand.getBind();
          break;
        case schema::Brand::Scope::INHERIT:
          // TODO(someday): We need to pay attention to INHERIT and be sure to explicitly override
          //   any bindings that are not inherited. This requires a way to determine which of our
          //   parent scopes have a non-empty parameter list.
          break;
      }
    }

    {
      Schema parent = target;
      while (parent.getProto().getScopeId() != 0) {
        parent = schemaLoader.get(parent.getProto().getScopeId());
        targetPath.add(parent);
      }
    }

    {
      Schema parent = scope;
      scopeParts.add(parent);
      while (parent.getProto().getScopeId() != 0) {
        parent = schemaLoader.get(parent.getProto().getScopeId());
        scopeParts.add(parent);
      }
    }

    // Remove common scope (unless it has been reparameterized).
    // TODO(someday):  This is broken in that we aren't checking for shadowing.
    while (!scopeParts.empty() && targetPath.size() > 1 &&
           scopeParts.back() == targetPath.back() &&
           scopeBindings.count(scopeParts.back().getProto().getId()) == 0) {
      scopeParts.removeLast();
      targetPath.removeLast();
    }

    auto parts = kj::heapArrayBuilder<kj::StringTree>(targetPath.size());
    while (!targetPath.empty()) {
      auto part = targetPath.back();
      auto proto = part.getProto();
      kj::StringTree partStr;
      if (proto.getScopeId() == 0) {
        partStr = kj::strTree("import \"/", proto.getDisplayName(), '\"');
      } else {
        partStr = kj::strTree(getUnqualifiedName(part));
      }

      auto iter = scopeBindings.find(proto.getId());
      if (iter != scopeBindings.end()) {
        auto bindings = KJ_MAP(binding, iter->second) {
          switch (binding.which()) {
            case schema::Brand::Binding::UNBOUND:
              return kj::strTree("AnyPointer");
            case schema::Brand::Binding::TYPE:
              return genType(binding.getType(), scope, method);
          }
          return kj::strTree("<unknown binding>");
        };
        partStr = kj::strTree(kj::mv(partStr), "(", kj::StringTree(kj::mv(bindings), ", "), ")");
      }

      parts.add(kj::mv(partStr));
      targetPath.removeLast();
    }

    return kj::StringTree(parts.finish(), ".");
  }